

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int luv_udp_try_send(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_c0 [8];
  sockaddr_storage addr;
  char *host;
  int port;
  int ret;
  uv_buf_t buf;
  uv_udp_t *handle;
  lua_State *L_local;
  
  buf.len = (size_t)luv_check_udp(L,1);
  luv_check_buf(L,2,(uv_buf_t *)&port);
  addr.__ss_align = (unsigned_long)luaL_checklstring(L,3,(size_t *)0x0);
  uVar2 = luaL_checkinteger(L,4);
  iVar1 = uv_ip4_addr((char *)addr.__ss_align,(int)uVar2,(sockaddr_in *)local_c0);
  if ((iVar1 != 0) &&
     (iVar1 = uv_ip6_addr((char *)addr.__ss_align,(int)uVar2,(sockaddr_in6 *)local_c0), iVar1 != 0))
  {
    iVar1 = luaL_error(L,"Invalid IP address or port [%s:%d]",addr.__ss_align,uVar2 & 0xffffffff);
    return iVar1;
  }
  iVar1 = uv_udp_try_send((uv_udp_t *)buf.len,(uv_buf_t *)&port,1,(sockaddr *)local_c0);
  if (iVar1 < 0) {
    L_local._4_4_ = luv_error(L,iVar1);
  }
  else {
    lua_pushinteger(L,(long)iVar1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_udp_try_send(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  int err_or_num_bytes;
  struct sockaddr_storage addr;
  struct sockaddr* addr_ptr;
  size_t count;
  uv_buf_t* bufs = luv_check_bufs_noref(L, 2, &count);
  addr_ptr = luv_check_addr(L, &addr, 3, 4);
  err_or_num_bytes = uv_udp_try_send(handle, bufs, count, addr_ptr);
  free(bufs);
  if (err_or_num_bytes < 0) return luv_error(L, err_or_num_bytes);
  lua_pushinteger(L, err_or_num_bytes);
  return 1;
}